

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.cc
# Opt level: O1

int __thiscall raptor::Connection::ParsingProtocol(Connection *this)

{
  IProtocol *pIVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  size_t sVar5;
  undefined4 extraout_var;
  uint8_t *puVar6;
  size_t sVar7;
  ulong len;
  SliceBuffer *this_00;
  byte bVar8;
  Slice package;
  int local_8c;
  Slice local_70;
  Slice local_50;
  
  this_00 = &this->_rcv_buffer;
  sVar5 = SliceBuffer::GetBufferLength(this_00);
  iVar3 = (*this->_proto->_vptr_IProtocol[2])();
  local_8c = 0;
  do {
    if (sVar5 == 0) goto LAB_001073e3;
    Slice::Slice(&local_50);
    bVar2 = ReadSliceFromRecvBuffer(this,CONCAT44(extraout_var,iVar3),&local_50);
    pIVar1 = this->_proto;
    puVar6 = Slice::begin(&local_50);
    sVar7 = Slice::size(&local_50);
    uVar4 = (*pIVar1->_vptr_IProtocol[3])(pIVar1,puVar6,sVar7);
    if ((int)uVar4 < 0) {
      bVar8 = 1;
      LogFormatPrint("/workspace/llm4binary/github/license_all_cmakelists_1510/shadow-yuan[P]raptor/core/linux/connection.cc"
                     ,0xed,kLogLevelError,"tcp client: internal protocol error(pack_len = %d)",
                     (ulong)uVar4);
    }
    else if (uVar4 == 0) {
      bVar8 = bVar2 + 5;
    }
    else {
      bVar8 = (sVar5 < uVar4) * '\x02' + 4;
    }
    if ((bVar8 & 0xfe) == 4) {
      sVar5 = Slice::size(&local_50);
      len = (ulong)(int)uVar4;
      if (sVar5 < len) {
        SliceBuffer::GetHeader(&local_70,this_00,len);
        Slice::operator=(&local_50,&local_70);
        Slice::~Slice(&local_70);
      }
      else {
        sVar5 = Slice::size(&local_50);
        Slice::CutTail(&local_50,sVar5 - len);
      }
      (*this->_service->_vptr_INotificationTransfer[3])(this->_service,this->_cid,&local_50);
      SliceBuffer::MoveHeader(this_00,len);
      sVar5 = SliceBuffer::GetBufferLength(this_00);
      local_8c = local_8c + 1;
      bVar8 = 0;
    }
    Slice::~Slice(&local_50);
  } while (bVar8 == 0);
  iVar3 = -1;
  if (bVar8 == 6) {
LAB_001073e3:
    iVar3 = local_8c;
  }
  return iVar3;
}

Assistant:

int Connection::ParsingProtocol() {
    size_t cache_size = _rcv_buffer.GetBufferLength();
    size_t header_size = _proto->GetMaxHeaderSize();
    int package_counter = 0;

    while (cache_size > 0) {
        size_t read_size = header_size;
        int pack_len = 0;
        Slice package;
        do {
            bool reach_tail = ReadSliceFromRecvBuffer(read_size, package);
            pack_len = _proto->CheckPackageLength(package.begin(), package.size());
            if (pack_len < 0) {
                log_error("tcp client: internal protocol error(pack_len = %d)", pack_len);
                return -1;
            }

            // equal 0 means we need more data
            if (pack_len == 0) {
                if (reach_tail) {
                    goto done;
                }
                read_size *= 2;
                continue;
            }

            // We got the length of a whole packet
            if (cache_size >= (size_t)pack_len) {
                break;
            }
            goto done;
        } while (false);

        if (package.size() < static_cast<size_t>(pack_len)) {
            package = _rcv_buffer.GetHeader(pack_len);
        } else {
            size_t n = package.size() - pack_len;
            package.CutTail(n);
        }
        _service->OnDataReceived(_cid, &package);
        _rcv_buffer.MoveHeader(pack_len);

        cache_size = _rcv_buffer.GetBufferLength();
        package_counter++;
    }
done:
    return package_counter;
}